

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateCache::ReloadAllIfChanged(TemplateCache *this,ReloadType reload_type)

{
  int iVar1;
  Mutex *pMVar2;
  Template *this_00;
  Strip strip;
  _Hash_node_base *p_Var3;
  TemplateString local_50;
  
  pMVar2 = this->mutex_;
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar1 + -1;
  if (iVar1 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xea,"void ctemplate::Mutex::Lock()");
  }
  if ((this->is_frozen_ == false) &&
     (p_Var3 = (this->parsed_template_cache_->_M_h)._M_before_begin._M_nxt,
     p_Var3 != (_Hash_node_base *)0x0)) {
    do {
      *(undefined1 *)&p_Var3[4]._M_nxt = 1;
      if (reload_type == IMMEDIATE_RELOAD) {
        this_00 = (Template *)(p_Var3[3]._M_nxt)->_M_nxt;
        local_50.ptr_ = Template::original_filename(this_00);
        if (local_50.ptr_ == (char *)0x0) {
          local_50.ptr_ = "";
        }
        local_50.length_ = strlen(local_50.ptr_);
        local_50.is_immutable_ = false;
        local_50.id_ = 0;
        strip = Template::strip(this_00);
        GetTemplateLocked(this,&local_50,strip,(TemplateCacheKey *)(p_Var3 + 1));
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
    pMVar2->mutex_ = pMVar2->mutex_ + 1;
    if (pMVar2->mutex_ != 0) {
      __assert_fail("mutex_++ == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                    ,0xeb,"void ctemplate::Mutex::Unlock()");
    }
  }
  else {
    pMVar2->mutex_ = 0;
  }
  return;
}

Assistant:

void TemplateCache::ReloadAllIfChanged(ReloadType reload_type) {
  WriterMutexLock ml(mutex_);
  if (is_frozen_) {  // do not reload a frozen cache.
    return;
  }
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end();
       ++it) {
    it->second.should_reload = true;
    if (reload_type == IMMEDIATE_RELOAD) {
      const Template* tpl = it->second.refcounted_tpl->tpl();
      // Reload should always use the original filename.
      // For instance on reload, we may replace an existing template with a
      // new one that came earlier on the search path.
      GetTemplateLocked(tpl->original_filename(), tpl->strip(), it->first);
    }
  }
}